

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDate __thiscall QDate::addMonths(QDate *this,int nmonths,QCalendar cal)

{
  QDate date;
  bool bVar1;
  int iVar2;
  int iVar3;
  QDate QVar4;
  qint64 qVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  YearMonthDay YVar10;
  QCalendar local_58;
  QCalendar local_50;
  YearMonthDay local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar5 = -0x8000000000000000;
  date = (QDate)this->jd;
  QVar4.jd = qVar5;
  local_58.d_ptr = cal.d_ptr;
  if ((0x16d3e147973 < date.jd + 0xb69eeff91fU) || (QVar4 = date, nmonths == 0)) goto LAB_00345bb8;
  YVar10 = QCalendar::partsFromDate(&local_58,date);
  QVar4.jd = qVar5;
  if (YVar10._0_8_ >> 0x20 == 0x80000000) goto LAB_00345bb8;
  uVar6 = YVar10.month + nmonths;
  uVar7 = (ulong)uVar6;
  uVar9 = CONCAT44(uVar6,YVar10.year);
  if ((int)uVar6 < 1) {
    do {
      iVar2 = (int)uVar9 + -1;
      if ((iVar2 != 0) || (bVar1 = QCalendar::hasYearZero(&local_58), bVar1)) {
        iVar8 = QCalendar::monthsInYear(&local_58,iVar2);
        uVar9 = CONCAT44((int)(uVar9 >> 0x20) + iVar8,iVar2);
      }
      else {
        uVar9 = uVar9 & 0xffffffff00000000;
      }
      uVar7 = uVar9 >> 0x20;
    } while ((int)(uVar9 >> 0x20) < 1);
  }
  iVar2 = QCalendar::monthsInYear(&local_58,(int)uVar9);
  uVar6 = (uint)uVar7;
  if (iVar2 < (int)uVar6) {
    do {
      iVar8 = (int)uVar9 + 1;
      if (iVar8 == 0) {
        bVar1 = QCalendar::hasYearZero(&local_58);
        iVar3 = 0;
        if (bVar1) goto LAB_00345ad8;
      }
      else {
LAB_00345ad8:
        iVar3 = QCalendar::monthsInYear(&local_58,iVar8);
      }
      uVar6 = (int)uVar7 - iVar2;
      uVar7 = (ulong)uVar6;
      uVar9 = CONCAT44(uVar6,(int)uVar9 + 1);
      iVar2 = iVar3;
    } while (iVar3 < (int)uVar6);
  }
  local_50.d_ptr = local_58.d_ptr;
  iVar2 = (int)uVar9;
  local_48._0_8_ = uVar9;
  if (iVar2 < 0) {
    bVar1 = QCalendar::isProleptic(&local_50);
LAB_00345b85:
    if (bVar1 == false) goto LAB_00345bb8;
  }
  else if (iVar2 == 0) {
    bVar1 = QCalendar::hasYearZero(&local_50);
    goto LAB_00345b85;
  }
  local_48.day = QCalendar::daysInMonth(&local_50,uVar6,iVar2);
  if (YVar10.day < local_48.day) {
    local_48.day = YVar10.day;
  }
  QVar4 = QCalendar::dateFromParts(&local_50,&local_48);
LAB_00345bb8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDate)QVar4.jd;
}

Assistant:

QDate QDate::addMonths(int nmonths, QCalendar cal) const
{
    if (!isValid())
        return QDate();

    if (nmonths == 0)
        return *this;

    auto parts = cal.partsFromDate(*this);

    if (!parts.isValid())
        return QDate();
    Q_ASSERT(parts.year || cal.hasYearZero());

    parts.month += nmonths;
    while (parts.month <= 0) {
        if (--parts.year || cal.hasYearZero())
            parts.month += cal.monthsInYear(parts.year);
    }
    int count = cal.monthsInYear(parts.year);
    while (parts.month > count) {
        parts.month -= count;
        count = (++parts.year || cal.hasYearZero()) ? cal.monthsInYear(parts.year) : 0;
    }

    return fixedDate(parts, cal);
}